

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::iterate(AtomicCompSwapCase *this)

{
  TextureFormat *format;
  pointer *pppSVar1;
  TextureType imageType;
  AtomicOperationCaseType AVar2;
  AtomicOperationCaseType AVar3;
  Functional *this_00;
  TestLog *log;
  ChannelType CVar4;
  deUint32 dVar5;
  int s;
  deUint32 dVar6;
  ContextType type;
  GLSLVersion version;
  Functions *gl;
  long lVar7;
  char *pcVar8;
  ProgramSources *sources;
  undefined8 uVar9;
  ImageLayerVerifier *verifyLayer;
  GLuint GVar10;
  undefined **ppuVar11;
  char *pcVar12;
  TextureFormat *format_00;
  RenderContext *renderContext;
  int x;
  ShaderType x_00;
  int y;
  int y_00;
  char *__s;
  ShaderProgram *this_01;
  GLuint z;
  TextureType TVar13;
  bool bVar14;
  bool bVar15;
  Vector<int,_3> local_bb4;
  deUint32 local_ba8;
  GLuint local_ba4;
  allocator<char> local_b9e;
  allocator<char> local_b9d;
  allocator<char> local_b9c;
  allocator<char> local_b9b;
  allocator<char> local_b9a;
  allocator<char> local_b99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  string local_b58;
  ChannelType local_b38;
  ShaderType local_b34;
  CallLogWrapper glLog;
  string curPixelInvocationNdx;
  string local_af0;
  string wrapX;
  Texture returnValueTexture;
  Texture endResultTexture;
  string colorScalarTypeName;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  undefined1 local_8e8 [8];
  GLuint local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  string shaderImageTypeStr;
  string atomicCoord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  string shaderImageFormatStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  string local_6e0;
  string local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string glslVersionDeclaration;
  string invocationCoord;
  string colorVecTypeName;
  LayeredImage imageData;
  ShaderProgram program;
  
  this_00 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  gl = (Functions *)(**(code **)(*(long *)this_00 + 0x18))(this_00);
  glu::CallLogWrapper::CallLogWrapper(&glLog,gl,log);
  dVar5 = glu::getInternalFormat(this->m_format);
  TVar13 = this->m_imageType;
  local_ba8 = getGLTextureTarget(TVar13);
  defaultImageSize((Functional *)&local_bb4,TVar13);
  local_b38 = (this->m_format).type;
  local_ba4 = local_bb4.m_data[2];
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    local_ba4 = 6;
  }
  bVar14 = (local_b38 & ~SNORM_INT16) != UNSIGNED_INT8;
  bVar15 = local_b38 != UNSIGNED_INT32;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&endResultTextureBuf,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&returnValueTextureBuf,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&endResultTexture,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&returnValueTexture,(RenderContext *)this_00);
  glLog.m_enableLog = true;
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::operator<<((ostream *)pppSVar1,"// Created a texture (name ");
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::operator<<((ostream *)pppSVar1,") to act as the target of atomic operations");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"// Created a buffer for the texture (name ");
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::operator<<((ostream *)pppSVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"// Created a texture (name ");
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::operator<<((ostream *)pppSVar1,
                    ") to which the intermediate return values of the atomic operation are stored");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      pppSVar1 = &program.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
      std::operator<<((ostream *)pppSVar1,"// Created a buffer for the texture (name ");
      std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
      std::operator<<((ostream *)pppSVar1,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    }
  }
  format = &this->m_format;
  LayeredImage::LayeredImage
            (&imageData,this->m_imageType,format,local_bb4.m_data[0],local_bb4.m_data[1],
             local_bb4.m_data[2]);
  local_b38 = local_b38 - SIGNED_INT8;
  z = 0;
  GVar10 = 0;
  if (0 < (int)local_ba4) {
    GVar10 = local_ba4;
  }
  for (; z != GVar10; z = z + 1) {
    for (y_00 = 0; y_00 < local_bb4.m_data[1]; y_00 = y_00 + 1) {
      for (x_00 = SHADERTYPE_VERTEX; (int)x_00 < local_bb4.m_data[0];
          x_00 = x_00 + SHADERTYPE_FRAGMENT) {
        local_8e8._0_4_ = x_00;
        local_8e8._4_4_ = y_00;
        local_8e0 = z;
        s = getCompareArg((IVec3 *)local_8e8,local_bb4.m_data[0]);
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&program,s);
        Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                  ((LayeredImage *)&imageData,x_00,y_00,z,(Vector<int,_4> *)&program);
      }
    }
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,local_ba8,endResultTexture.super_ObjectWrapper.m_object)
  ;
  setTexParameteri(&glLog,local_ba8);
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::operator<<((ostream *)pppSVar1,"// Filling end-result texture with initial pattern");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  uploadTexture(&glLog,&imageData,endResultTextureBuf.super_ObjectWrapper.m_object);
  LayeredImage::~LayeredImage(&imageData);
  TVar13 = TEXTURETYPE_CUBE;
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,endResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,dVar5);
  lVar7 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x951);
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&glLog,local_ba8,returnValueTexture.super_ObjectWrapper.m_object);
    setTexParameteri(&glLog,local_ba8);
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,"// Setting storage of return-value texture");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    imageType = this->m_imageType;
    imageData.m_size.m_data[0] = (uint)(imageType == TEXTURETYPE_CUBE) * 4 + 1;
    imageData.m_type = TEXTURETYPE_1D;
    imageData.m_size.m_data[1] = 1;
    tcu::operator*((tcu *)&program,&local_bb4,(Vector<int,_3> *)&imageData);
    setTextureStorage(&glLog,imageType,dVar5,(IVec3 *)&program,
                      returnValueTextureBuf.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindImageTexture
              (&glLog,1,returnValueTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar5);
    lVar7 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x961);
  }
  CVar4 = local_b38;
  pcVar8 = (char *)0x0;
  if (local_b38 < 3) {
    pcVar8 = "int";
  }
  pcVar12 = "uint";
  if (bVar15 && bVar14) {
    pcVar12 = pcVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorScalarTypeName,pcVar12,(allocator<char> *)&program);
  pcVar8 = (char *)0x0;
  if (CVar4 < 3) {
    pcVar8 = "i";
  }
  pcVar12 = "u";
  if (bVar15 && bVar14) {
    pcVar12 = pcVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,pcVar12,(allocator<char> *)&imageData);
  std::operator+(&colorVecTypeName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 "vec4");
  std::__cxx11::string::~string((string *)&program);
  if (this->m_imageType == TEXTURETYPE_2D) {
    wrapX._M_dataplus._M_p._0_4_ = local_bb4.m_data[0];
    de::toString<int>((string *)&imageData,(int *)&wrapX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                   "ivec2(gx % ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData);
    std::operator+(&atomicCoord,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                   ", gy)");
LAB_01256551:
    std::__cxx11::string::~string((string *)&program);
    this_01 = (ShaderProgram *)&imageData;
  }
  else {
    if (this->m_imageType != TEXTURETYPE_BUFFER) {
      curPixelInvocationNdx._M_dataplus._M_p._0_4_ = local_bb4.m_data[0];
      de::toString<int>((string *)&imageData,(int *)&curPixelInvocationNdx);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                     "ivec3(gx % ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData
                    );
      std::operator+(&atomicCoord,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                     ", gy, gz)");
      goto LAB_01256551;
    }
    local_8e8._0_4_ = local_bb4.m_data[0];
    de::toString<int>((string *)&program,(int *)local_8e8);
    std::operator+(&atomicCoord,"gx % ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program);
    this_01 = &program;
  }
  std::__cxx11::string::~string((string *)this_01);
  pcVar8 = "ivec2(gx, gy)";
  pcVar12 = "ivec3(gx, gy, gz)";
  if (this->m_imageType == TEXTURETYPE_2D) {
    pcVar12 = "ivec2(gx, gy)";
  }
  __s = "gx";
  if (this->m_imageType != TEXTURETYPE_BUFFER) {
    __s = pcVar12;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invocationCoord,__s,(allocator<char> *)&program);
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)format,format_00);
  getShaderImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,this->m_imageType,
             (TextureType)pcVar8);
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this_00 + 0x10))(this_00);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar12 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar12,(allocator<char> *)&program);
  memset(&imageData,0,0xac);
  std::operator+(&local_6a0,&glslVersionDeclaration,"\n");
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_6c0,this_00,renderContext);
  std::operator+(&local_680,&local_6a0,&local_6c0);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_6e0,(Functional *)(ulong)this->m_imageType,(TextureType)this_00,
             (RenderContext *)pcVar8);
  std::operator+(&local_660,&local_680,&local_6e0);
  std::operator+(&local_640,&local_660,"\nprecision highp ");
  std::operator+(&local_620,&local_640,&shaderImageTypeStr);
  std::operator+(&local_600,&local_620,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_5e0,&local_600,&shaderImageFormatStr);
  std::operator+(&local_5c0,&local_5e0,", binding=0) coherent uniform ");
  std::operator+(&local_5a0,&local_5c0,&shaderImageTypeStr);
  std::operator+(&local_580,&local_5a0," u_results;\n");
  AVar2 = this->m_caseType;
  if (AVar2 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_720,"layout (",&shaderImageFormatStr);
    std::operator+(&local_700,&local_720,", binding=1) writeonly uniform ");
    std::operator+(&local_7a0,&local_700,&shaderImageTypeStr);
    std::operator+(&local_780,&local_7a0," u_returnValues;\n");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_7a0);
  }
  std::operator+(&local_560,&local_580,&local_780);
  std::operator+(&local_540,&local_560,
                 "\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\tint gz = int(gl_GlobalInvocationID.z);\n\t"
                );
  std::operator+(&local_520,&local_540,&colorScalarTypeName);
  std::operator+(&local_500,&local_520," compare = ");
  std::operator+(&local_4e0,&local_500,&colorScalarTypeName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"gx",&local_b99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"gy",&local_b9a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"gz",&local_b9b);
  local_8c0._M_dataplus._M_p._0_4_ = local_bb4.m_data[0];
  std::operator+(&local_b98,"(",&local_7c0);
  std::operator+(&local_b78,&local_b98,"%");
  de::toString<int>(&local_b58,(int *)&local_8c0);
  std::operator+(&curPixelInvocationNdx,&local_b78,&local_b58);
  std::operator+(&wrapX,&curPixelInvocationNdx,")");
  std::__cxx11::string::~string((string *)&curPixelInvocationNdx);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::operator+(&local_b58,"(",&local_7c0);
  std::operator+(&local_b98,&local_b58,"/");
  de::toString<int>(&local_af0,(int *)&local_8c0);
  std::operator+(&local_b78,&local_b98,&local_af0);
  std::operator+(&curPixelInvocationNdx,&local_b78,")");
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_b58);
  std::operator+(&local_a08,"(",&wrapX);
  std::operator+(&local_9e8,&local_a08,"*");
  std::operator+(&local_9c8,&local_9e8,&wrapX);
  std::operator+(&local_9a8,&local_9c8," + ");
  std::operator+(&local_988,&local_9a8,&local_7e0);
  std::operator+(&local_968,&local_988,"*");
  std::operator+(&local_948,&local_968,&local_7e0);
  std::operator+(&local_928,&local_948," + ");
  std::operator+(&local_908,&local_928,&local_800);
  std::operator+(&local_af0,&local_908,"*");
  std::operator+(&local_b58,&local_af0,&local_800);
  std::operator+(&local_b98,&local_b58," + ");
  std::operator+(&local_b78,&local_b98,&curPixelInvocationNdx);
  std::operator+(&local_740,&local_b78,"*42)");
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&curPixelInvocationNdx);
  std::__cxx11::string::~string((string *)&wrapX);
  std::operator+(&local_4c0,&local_4e0,&local_740);
  std::operator+(&local_4a0,&local_4c0,";\n\t");
  std::operator+(&local_480,&local_4a0,&colorScalarTypeName);
  std::operator+(&local_460,&local_480," data    = ");
  std::operator+(&local_440,&local_460,&colorScalarTypeName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"gx",&local_b9c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"gy",&local_b9d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"gz",&local_b9e);
  local_b34 = local_bb4.m_data[0];
  std::operator+(&local_b98,"(",&local_820);
  std::operator+(&local_b78,&local_b98,"%");
  de::toString<int>(&local_b58,(int *)&local_b34);
  std::operator+(&curPixelInvocationNdx,&local_b78,&local_b58);
  std::operator+(&wrapX,&curPixelInvocationNdx,")");
  std::__cxx11::string::~string((string *)&curPixelInvocationNdx);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::operator+(&local_b58,"(",&local_820);
  std::operator+(&local_b98,&local_b58,"/");
  de::toString<int>(&local_af0,(int *)&local_b34);
  std::operator+(&local_b78,&local_b98,&local_af0);
  std::operator+(&curPixelInvocationNdx,&local_b78," + 1)");
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_b58);
  std::operator+(&local_a08,"(",&wrapX);
  std::operator+(&local_9e8,&local_a08,"*");
  std::operator+(&local_9c8,&local_9e8,&wrapX);
  std::operator+(&local_9a8,&local_9c8," + ");
  std::operator+(&local_988,&local_9a8,&local_840);
  std::operator+(&local_968,&local_988,"*");
  std::operator+(&local_948,&local_968,&local_840);
  std::operator+(&local_928,&local_948," + ");
  std::operator+(&local_908,&local_928,&local_860);
  std::operator+(&local_af0,&local_908,"*");
  std::operator+(&local_b58,&local_af0,&local_860);
  std::operator+(&local_b98,&local_b58," + ");
  std::operator+(&local_b78,&local_b98,&curPixelInvocationNdx);
  std::operator+(&local_8c0,&local_b78,"*42)");
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&curPixelInvocationNdx);
  std::__cxx11::string::~string((string *)&wrapX);
  std::operator+(&local_420,&local_440,&local_8c0);
  std::operator+(&local_400,&local_420,";\n\t");
  std::operator+(&local_3e0,&local_400,&colorScalarTypeName);
  std::operator+(&local_3c0,&local_3e0," status  = ");
  std::operator+(&local_3a0,&local_3c0,&colorScalarTypeName);
  std::operator+(&local_380,&local_3a0,"(-1);\n\tstatus = imageAtomicCompSwap(u_results, ");
  std::operator+(&local_360,&local_380,&atomicCoord);
  std::operator+(&local_340,&local_360,", compare, data);\n");
  AVar3 = this->m_caseType;
  if (AVar3 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_b98,"\timageStore(u_returnValues, ",&invocationCoord);
    std::operator+(&local_b78,&local_b98,", ");
    std::operator+(&curPixelInvocationNdx,&local_b78,&colorVecTypeName);
    std::operator+(&wrapX,&curPixelInvocationNdx,"(status));\n");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wrapX,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&curPixelInvocationNdx);
  }
  std::operator+(&local_320,&local_340,&wrapX);
  std::operator+(&local_300,&local_320,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)local_8e8,&local_300);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&imageData,(ShaderSource *)local_8e8);
  glu::ShaderProgram::ShaderProgram(&program,(RenderContext *)this_00,sources);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&wrapX);
  if (AVar3 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::__cxx11::string::~string((string *)&curPixelInvocationNdx);
    std::__cxx11::string::~string((string *)&local_b78);
    std::__cxx11::string::~string((string *)&local_b98);
  }
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_780);
  if (AVar2 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_720);
  }
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6a0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&imageData);
  uVar9 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
  imageData.m_tex2D.m_state = (SharedPtrStateBase *)&imageData.m_texBuffer.m_state;
  imageData.m_type = (TextureType)uVar9;
  imageData.m_size.m_data[0] = (int)((ulong)uVar9 >> 0x20);
  imageData.m_size.m_data[1] = (int)log;
  imageData.m_size.m_data[2] = (int)((ulong)log >> 0x20);
  imageData.m_format.order = program.m_program.m_program;
  imageData.m_texBuffer.m_state._0_4_ = 0;
  imageData.m_tex2D.m_ptr = (Texture2D *)0x0;
  imageData.m_texCube.m_state = (SharedPtrStateBase *)0x0;
  imageData.m_texCube.m_ptr = (TextureCube *)imageData.m_tex2D.m_state;
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,program.m_program.m_program);
    glu::CallLogWrapper::glDispatchCompute
              (&glLog,local_bb4.m_data[0] * 5,local_bb4.m_data[1],local_ba4);
    lVar7 = (**(code **)(*(long *)this_00 + 0x18))(this_00);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x99f);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&imageData.m_texBuffer);
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  std::__cxx11::string::~string((string *)&shaderImageTypeStr);
  std::__cxx11::string::~string((string *)&shaderImageFormatStr);
  std::__cxx11::string::~string((string *)&invocationCoord);
  std::__cxx11::string::~string((string *)&atomicCoord);
  std::__cxx11::string::~string((string *)&colorVecTypeName);
  std::__cxx11::string::~string((string *)&colorScalarTypeName);
  if (program.m_program.m_info.linkOk == false) goto LAB_0125779f;
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
LAB_012576b2:
    TVar13 = TEXTURETYPE_1D;
    dVar5 = returnValueTextureBuf.super_ObjectWrapper.m_object;
    dVar6 = returnValueTexture.super_ObjectWrapper.m_object;
  }
  else {
    dVar5 = endResultTextureBuf.super_ObjectWrapper.m_object;
    dVar6 = endResultTexture.super_ObjectWrapper.m_object;
    if (this->m_caseType != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      returnValueTextureBuf.super_ObjectWrapper.m_object = 0xffffffff;
      returnValueTexture.super_ObjectWrapper.m_object =
           returnValueTextureBuf.super_ObjectWrapper.m_object;
      goto LAB_012576b2;
    }
  }
  imageData.m_size.m_data[0] = 1;
  imageData.m_size.m_data[1] = 1;
  imageData.m_type = TVar13;
  tcu::operator*((tcu *)&program,&local_bb4,(Vector<int,_3> *)&imageData);
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
    verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
    TVar13 = this->m_imageType;
    ppuVar11 = &PTR_operator___01e532e0;
LAB_01257730:
    verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)ppuVar11;
    *(TextureType *)&verifyLayer[1]._vptr_ImageLayerVerifier = TVar13;
    *(int *)((long)&verifyLayer[1]._vptr_ImageLayerVerifier + 4) = local_bb4.m_data[0];
  }
  else {
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
      TVar13 = this->m_imageType;
      ppuVar11 = &PTR_operator___01e53320;
      goto LAB_01257730;
    }
    TVar13 = this->m_imageType;
    verifyLayer = (ImageLayerVerifier *)0x0;
  }
  bVar14 = readTextureAndVerify
                     ((RenderContext *)this_00,&glLog,dVar6,dVar5,TVar13,format,(IVec3 *)&program,
                      verifyLayer);
  pcVar8 = "Image verification failed";
  if (bVar14) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar14,pcVar8);
  (*verifyLayer->_vptr_ImageLayerVerifier[2])(verifyLayer);
LAB_0125779f:
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

AtomicCompSwapCase::IterateResult AtomicCompSwapCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	DE_ASSERT(isUintFormat || isIntFormat);

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, IVec4(getCompareArg(IVec3(x, y, z), imageSize.x())));
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform atomics in compute shader.

	{
		// Generate compute shader.

		const string colorScalarTypeName	= isUintFormat ? "uint" : isIntFormat ? "int" : DE_NULL;
		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : DE_NULL) + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const string glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														"	" + colorScalarTypeName + " compare = " + colorScalarTypeName + getCompareArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " data    = " + colorScalarTypeName + getAssignArgShaderStr("gx", "gy", "gz", imageSize.x()) + ";\n"
														"	" + colorScalarTypeName + " status  = " + colorScalarTypeName + "(-1);\n"
														"	status = imageAtomicCompSwap(u_results, " + atomicCoord + ", compare, data);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(status));\n" :
															"") +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Create reference, read texture and compare.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;

		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		// The relevant region of the texture being checked (potentially
		// different from actual texture size for cube maps, because cube maps
		// may have unused pixels due to square size restriction).
		const IVec3									relevantRegion		= imageSize * (m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT	? IVec3(1,							1,							1)
																					 :														  IVec3(NUM_INVOCATIONS_PER_PIXEL,	1,							1));

		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_imageType, imageSize.x())
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_imageType, imageSize.x())
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, relevantRegion, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}